

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImVector<int>::push_front(ImVector<int> *this,int *v)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  uint uVar4;
  
  uVar1 = this->Size;
  if (uVar1 == 0) {
    if (this->Capacity == 0) {
      piVar2 = (int *)ImGui::MemAlloc(0x20);
      if (this->Data != (int *)0x0) {
        memcpy(piVar2,this->Data,(long)this->Size << 2);
        ImGui::MemFree(this->Data);
      }
      this->Data = piVar2;
      this->Capacity = 8;
      lVar3 = (long)this->Size;
    }
    else {
      piVar2 = this->Data;
      lVar3 = 0;
    }
    piVar2 = piVar2 + lVar3;
  }
  else {
    if ((int)uVar1 < 0) {
      __assert_fail("it >= Data && it <= Data+Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                    ,0x4f2,"T *ImVector<int>::insert(const T *, const T &) [T = int]");
    }
    if (uVar1 == this->Capacity) {
      uVar4 = (uVar1 >> 1) + uVar1;
      if (uVar4 <= uVar1 + 1) {
        uVar4 = uVar1 + 1;
      }
      piVar2 = (int *)ImGui::MemAlloc((ulong)uVar4 * 4);
      if (this->Data != (int *)0x0) {
        memcpy(piVar2,this->Data,(long)this->Size << 2);
        ImGui::MemFree(this->Data);
      }
      this->Data = piVar2;
      this->Capacity = uVar4;
      uVar1 = this->Size;
      if ((int)uVar1 < 1) goto LAB_001331ed;
    }
    else {
      piVar2 = this->Data;
    }
    memmove(piVar2 + 1,piVar2,(ulong)uVar1 << 2);
    piVar2 = this->Data;
  }
LAB_001331ed:
  *piVar2 = *v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }